

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O0

void crnlib::Hc4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int in_ESI;
  long *in_RDI;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 hash3Value;
  UInt32 hash2Value;
  int local_c;
  
  local_c = in_ESI;
  do {
    if (*(uint *)((long)in_RDI + 0x14) < 4) {
      MatchFinder_MovePos((CMatchFinder *)0x24687a);
    }
    else {
      pbVar4 = (byte *)*in_RDI;
      uVar5 = *(uint *)((long)in_RDI + (ulong)*pbVar4 * 4 + 0x84) ^ (uint)pbVar4[1];
      bVar1 = pbVar4[2];
      uVar6 = (uVar5 ^ (uint)pbVar4[2] << 8 ^
              *(int *)((long)in_RDI + (ulong)pbVar4[3] * 4 + 0x84) << 5) & *(uint *)(in_RDI + 7);
      uVar2 = *(undefined4 *)(in_RDI[5] + (ulong)(uVar6 + 0x10400) * 4);
      uVar3 = (undefined4)in_RDI[1];
      *(undefined4 *)(in_RDI[5] + (ulong)(uVar6 + 0x10400) * 4) = uVar3;
      *(undefined4 *)(in_RDI[5] + (ulong)(((uVar5 ^ (uint)bVar1 << 8) & 0xffff) + 0x400) * 4) =
           uVar3;
      *(undefined4 *)(in_RDI[5] + (ulong)(uVar5 & 0x3ff) * 4) = uVar3;
      *(undefined4 *)(in_RDI[6] + (ulong)*(uint *)(in_RDI + 3) * 4) = uVar2;
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar7 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar7;
      if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x2469ca);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

static void Hc4_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    UInt32 hash2Value, hash3Value;
    SKIP_HEADER(4)
    HASH4_CALC;
    curMatch = p->hash[kFix4HashSize + hashValue];
    p->hash[hash2Value] =
        p->hash[kFix3HashSize + hash3Value] =
            p->hash[kFix4HashSize + hashValue] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  } while (--num != 0);
}